

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O2

void __thiscall libtorrent::peer_ban_alert::~peer_ban_alert(peer_ban_alert *this)

{
  torrent_alert::~torrent_alert((torrent_alert *)this);
  operator_delete(this,0xa0);
  return;
}

Assistant:

struct TORRENT_EXPORT peer_ban_alert final : peer_alert
	{
		// internal
		peer_ban_alert(aux::stack_allocator& alloc, torrent_handle h
			, tcp::endpoint const& ep, peer_id const& peer_id);

		TORRENT_DEFINE_ALERT(peer_ban_alert, 19)

		static constexpr alert_category_t static_category = alert_category::peer;
		std::string message() const override;
	}